

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O3

void __thiscall namedlabels::namedlabels(namedlabels *this,string *label_list)

{
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *this_00;
  v_hashmap<substring,_unsigned_long> *this_01;
  char *__s;
  hash_elem *__ptr;
  pointer psVar1;
  uint32_t uVar2;
  uint uVar3;
  char *__dest;
  size_t __n;
  unsigned_long *puVar4;
  vw_exception *this_02;
  substring *key;
  size_t sVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong hash;
  substring s;
  substring l_copy;
  ulong local_1e0;
  string local_1d8;
  substring local_1b8;
  ostream local_1a8;
  
  (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->name2id).dat;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize(this_00,0x3ff);
  this_01 = &this->name2id;
  (this->name2id).last_position = 0;
  (this->name2id).num_occupants = 0;
  (this->name2id).eq_data = (void *)0x0;
  this_01->equivalent = (_func_bool_void_ptr_substring_ptr_substring_ptr *)0x0;
  (this->name2id).equivalent_no_data = (_func_bool_substring_ptr_substring_ptr *)0x0;
  __dest = calloc_or_throw<char>(label_list->_M_string_length + 1);
  __s = (label_list->_M_dataplus)._M_p;
  __n = strlen(__s);
  memcpy(__dest,__s,__n);
  s.end = __dest + label_list->_M_string_length;
  s.begin = __dest;
  tokenize<std::vector<substring,std::allocator<substring>>>(',',s,&this->id2name,false);
  __ptr = (this->name2id).dat._begin;
  uVar2 = (uint32_t)
          ((ulong)((long)(this->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4);
  this->K = uVar2;
  if (__ptr != (hash_elem *)0x0) {
    free(__ptr);
    uVar2 = this->K;
  }
  this_00->_begin = (hash_elem *)0x0;
  (this->name2id).dat._end = (hash_elem *)0x0;
  (this->name2id).dat.end_array = (hash_elem *)0x0;
  uVar3 = uVar2 * 4 + 1;
  sVar5 = 0x3ff;
  if (0x3ff < uVar3) {
    sVar5 = (size_t)uVar3;
  }
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize(this_00,sVar5);
  (this->name2id).default_value = 0;
  (this->name2id).equivalent = (_func_bool_void_ptr_substring_ptr_substring_ptr *)0x0;
  (this->name2id).equivalent_no_data = substring_equal;
  (this->name2id).eq_data = (void *)0x0;
  (this->name2id).last_position = 0;
  (this->name2id).num_occupants = 0;
  if (this->K != 0) {
    uVar11 = 0;
    do {
      psVar1 = (this->id2name).super__Vector_base<substring,_std::allocator<substring>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (int)psVar1[uVar11].end - (int)psVar1[uVar11].begin;
      uVar7 = uVar3;
      if ((int)uVar3 < 0) {
        uVar7 = uVar3 + 3;
      }
      pbVar6 = (byte *)(psVar1[uVar11].begin + (int)(uVar7 & 0xfffffffc));
      uVar10 = 0x5c621;
      if (6 < uVar3 + 3) {
        lVar9 = (long)-((int)uVar7 >> 2);
        do {
          uVar10 = ((uint)(*(int *)(pbVar6 + lVar9 * 4) * -0x3361d2af) >> 0x11 |
                   *(int *)(pbVar6 + lVar9 * 4) * 0x16a88000) * 0x1b873593 ^ uVar10;
          uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0);
      }
      uVar8 = 0;
      uVar7 = 0;
      switch(uVar3 & 3) {
      case 3:
        uVar7 = (uint)pbVar6[2] << 0x10;
      case 2:
        uVar8 = uVar7 | (uint)pbVar6[1] << 8;
      case 1:
        uVar10 = uVar10 ^ ((*pbVar6 ^ uVar8) * -0x3361d2af >> 0x11 | (*pbVar6 ^ uVar8) * 0x16a88000)
                          * 0x1b873593;
      }
      key = psVar1 + uVar11;
      uVar3 = ((uVar10 ^ uVar3) >> 0x10 ^ uVar10 ^ uVar3) * -0x7a143595;
      uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
      hash = (ulong)(uVar3 >> 0x10 ^ uVar3);
      puVar4 = v_hashmap<substring,_unsigned_long>::get(this_01,key,hash);
      if (*puVar4 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"error: label dictionary initialized with multiple occurances of: ",
                   0x41);
        ::operator<<(&local_1a8,key);
        this_02 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this_02,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/global_data.h"
                   ,0xbe,&local_1d8);
        __cxa_throw(this_02,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      sVar5 = (long)key->end - (long)key->begin;
      local_1b8.begin = calloc_or_throw<char>(sVar5);
      local_1b8.end = (char *)0x0;
      memcpy(local_1b8.begin,key->begin,sVar5);
      local_1b8.end = local_1b8.begin + sVar5;
      uVar11 = uVar11 + 1;
      local_1e0 = uVar11;
      v_hashmap<substring,_unsigned_long>::get(this_01,&local_1b8,hash);
      v_hashmap<substring,_unsigned_long>::put_after_get(this_01,&local_1b8,hash,&local_1e0);
    } while (uVar11 < this->K);
  }
  return;
}

Assistant:

namedlabels(std::string label_list)
  {
    char* temp = calloc_or_throw<char>(1 + label_list.length());
    memcpy(temp, label_list.c_str(), strlen(label_list.c_str()));
    substring ss = {temp, nullptr};
    ss.end = ss.begin + label_list.length();
    tokenize(',', ss, id2name);

    K = (uint32_t)id2name.size();
    name2id.delete_v();  // delete automatically allocated vector.
    name2id.init(4 * K + 1, 0, substring_equal);
    for (size_t k = 0; k < K; k++)
    {
      substring& l = id2name[k];
      uint64_t hash = uniform_hash((unsigned char*)l.begin, l.end - l.begin, 378401);
      uint64_t id = name2id.get(l, hash);
      if (id != 0)  // TODO: memory leak: char* temp
        THROW("error: label dictionary initialized with multiple occurances of: " << l);
      size_t len = l.end - l.begin;
      substring l_copy = {calloc_or_throw<char>(len), nullptr};
      memcpy(l_copy.begin, l.begin, len * sizeof(char));
      l_copy.end = l_copy.begin + len;
      name2id.put(l_copy, hash, k + 1);
    }
  }